

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_nodes.cpp
# Opt level: O2

void __thiscall
duckdb::SerializedReadCSVData::Serialize(SerializedReadCSVData *this,Serializer *serializer)

{
  Serializer::WritePropertyWithDefault<duckdb::vector<std::__cxx11::string,true>>
            (serializer,100,"files",&this->files);
  Serializer::WritePropertyWithDefault<duckdb::vector<duckdb::LogicalType,true>>
            (serializer,0x65,"csv_types",&this->csv_types);
  Serializer::WritePropertyWithDefault<duckdb::vector<std::__cxx11::string,true>>
            (serializer,0x66,"csv_names",&this->csv_names);
  Serializer::WritePropertyWithDefault<duckdb::vector<duckdb::LogicalType,true>>
            (serializer,0x67,"return_types",&this->return_types);
  Serializer::WritePropertyWithDefault<duckdb::vector<std::__cxx11::string,true>>
            (serializer,0x68,"return_names",&this->return_names);
  Serializer::WritePropertyWithDefault<unsigned_long>
            (serializer,0x69,"filename_col_idx",&this->filename_col_idx);
  Serializer::WriteProperty<duckdb::SerializedCSVReaderOptions>
            (serializer,0x6a,"options",&this->options);
  Serializer::WriteProperty<duckdb::MultiFileReaderBindData>
            (serializer,0x6b,"reader_bind",&this->reader_bind);
  Serializer::WritePropertyWithDefault<duckdb::vector<duckdb::ColumnInfo,true>>
            (serializer,0x6c,"column_info",&this->column_info);
  return;
}

Assistant:

void SerializedReadCSVData::Serialize(Serializer &serializer) const {
	serializer.WritePropertyWithDefault<vector<string>>(100, "files", files);
	serializer.WritePropertyWithDefault<vector<LogicalType>>(101, "csv_types", csv_types);
	serializer.WritePropertyWithDefault<vector<string>>(102, "csv_names", csv_names);
	serializer.WritePropertyWithDefault<vector<LogicalType>>(103, "return_types", return_types);
	serializer.WritePropertyWithDefault<vector<string>>(104, "return_names", return_names);
	serializer.WritePropertyWithDefault<idx_t>(105, "filename_col_idx", filename_col_idx);
	serializer.WriteProperty<SerializedCSVReaderOptions>(106, "options", options);
	serializer.WriteProperty<MultiFileReaderBindData>(107, "reader_bind", reader_bind);
	serializer.WritePropertyWithDefault<vector<ColumnInfo>>(108, "column_info", column_info);
}